

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 float32_scalbn_arm(float32 a,int n,float_status *status)

{
  float32 fVar1;
  FloatParts FVar2;
  FloatParts pr;
  FloatParts pa;
  float_status *status_local;
  int n_local;
  float32 a_local;
  
  FVar2 = float32_unpack_canonical(a,status);
  FVar2 = scalbn_decomposed(FVar2,n,status);
  fVar1 = float32_round_pack_canonical(FVar2,status);
  return fVar1;
}

Assistant:

float32 float32_scalbn(float32 a, int n, float_status *status)
{
    FloatParts pa = float32_unpack_canonical(a, status);
    FloatParts pr = scalbn_decomposed(pa, n, status);
    return float32_round_pack_canonical(pr, status);
}